

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asa152.cpp
# Opt level: O2

double chyper(bool point,int kk,int ll,int mm,int nn,int *ifault)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double local_38;
  
  if ((((nn < 0) || (mm < kk)) || (kk < 0)) || (iVar17 = mm - nn, mm < nn)) {
    *ifault = 1;
    return 0.0;
  }
  if ((ll < 0) || (iVar9 = kk - ll, iVar17 < iVar9)) {
    *ifault = 2;
    return 0.0;
  }
  iVar11 = ll - kk;
  if ((uint)kk <= (uint)ll && iVar11 != 0 || (uint)nn < (uint)ll) {
    dVar28 = 0.0;
    if (!point) {
      dVar28 = 1.0;
    }
    *ifault = 2;
    return dVar28;
  }
  *ifault = 0;
  if (kk == 0) {
    return 1.0;
  }
  if (mm == nn) {
    return 1.0;
  }
  iVar2 = mm - kk;
  if (iVar2 == 0) {
    return 1.0;
  }
  if (nn == 0) {
    return 1.0;
  }
  if ((!point) && (iVar3 = i4_min(kk,nn), iVar3 == ll)) {
    return 1.0;
  }
  local_38 = (double)nn / (double)iVar17;
  dVar28 = r8_max(local_38,1.0 / local_38);
  iVar3 = i4_min(kk,iVar2);
  if ((1000 < (uint)mm) && (dVar28 * 16.0 < (double)iVar3)) {
    dVar27 = (double)(nn * kk) / (double)mm;
    dVar28 = ((double)iVar2 / (double)(mm + -1)) * ((double)iVar17 / (double)mm) * dVar27;
    if (dVar28 < 0.0) {
      dVar28 = sqrt(dVar28);
    }
    else {
      dVar28 = SQRT(dVar28);
    }
    if (!point) {
      dVar28 = alnorm((((double)ll + 0.5) - dVar27) / dVar28,false);
      return dVar28;
    }
    dVar27 = ((double)ll - dVar27) / dVar28;
    dVar27 = dVar27 * dVar27 * -0.5;
    if (-88.0 <= dVar27) {
      dVar27 = exp(dVar27);
      return dVar27 / (dVar28 * 2.506628274631001);
    }
    return 0.0;
  }
  iVar3 = kk + 1;
  iVar15 = mm + 1;
  iVar4 = nn + 1;
  iVar5 = i4_min(nn,iVar17);
  iVar6 = i4_min(kk,iVar2);
  iVar1 = iVar4;
  iVar7 = iVar3;
  if (iVar5 < iVar6) {
    iVar1 = iVar3;
    iVar7 = iVar4;
  }
  iVar16 = iVar15 - iVar7;
  iVar6 = iVar7 + -1;
  iVar5 = iVar1 - ll;
  if (iVar6 <= iVar16) {
    iVar5 = ll + 1;
  }
  bVar18 = iVar6 <= iVar16;
  iVar13 = iVar16 + 1;
  if (iVar6 <= iVar16) {
    iVar13 = iVar7;
  }
  if ((uint)mm < 0x259) {
    iVar7 = iVar6;
    if (iVar16 < iVar6) {
      iVar7 = iVar16;
    }
    iVar8 = 1;
    dVar28 = 1.0;
    iVar14 = mm;
    iVar10 = iVar1;
    iVar12 = iVar5;
    while( true ) {
      iVar12 = iVar12 + -1;
      iVar10 = iVar10 + -1;
      if (iVar5 <= iVar8) break;
      dVar28 = (dVar28 * (double)(iVar7 * iVar10)) / (double)(iVar12 * iVar14);
      iVar8 = iVar8 + 1;
      iVar7 = iVar7 + -1;
      iVar14 = iVar14 + -1;
    }
    if (iVar13 != iVar5) {
      iVar8 = iVar15 - iVar1;
      iVar15 = iVar15 - iVar5;
      for (iVar7 = iVar5; iVar7 < iVar13; iVar7 = iVar7 + 1) {
        dVar28 = (dVar28 * (double)iVar8) / (double)iVar15;
        iVar8 = iVar8 + -1;
        iVar15 = iVar15 + -1;
      }
    }
LAB_001a8d53:
    if (point) {
      return dVar28;
    }
    if ((dVar28 != 0.0) || (NAN(dVar28))) {
      dVar27 = dVar28 * 1e+35;
      goto LAB_001a8ef6;
    }
    if (mm < 0x259) {
      dVar27 = alnfac(nn);
      dVar20 = alnfac(mm);
      dVar21 = alnfac(kk);
      dVar22 = alnfac(iVar17);
      dVar23 = alnfac(ll);
      dVar24 = alnfac(nn - ll);
      dVar25 = alnfac(iVar9);
      dVar26 = alnfac(iVar11 + iVar17);
      local_38 = alnfac(iVar2);
      local_38 = local_38 +
                 (((((dVar22 + dVar21 + (dVar27 - dVar20)) - dVar23) - dVar24) - dVar25) - dVar26);
    }
  }
  else {
    dVar28 = alnfac(nn);
    dVar27 = alnfac(mm);
    dVar20 = alnfac(iVar2);
    dVar21 = alnfac(kk);
    dVar22 = alnfac(iVar17);
    dVar23 = alnfac(ll);
    dVar24 = alnfac(nn - ll);
    dVar25 = alnfac(iVar9);
    local_38 = alnfac(iVar11 + iVar17);
    local_38 = ((((dVar22 + dVar21 + dVar20 + (dVar28 - dVar27)) - dVar23) - dVar24) - dVar25) -
               local_38;
    if (-88.0 <= local_38) {
      dVar28 = exp(local_38);
      goto LAB_001a8d53;
    }
    dVar28 = 0.0;
    if (point) {
      return 0.0;
    }
  }
  if (local_38 + 80.5904782547916 < -88.0) {
    *ifault = 3;
    uVar19 = -(ulong)((double)(iVar3 * iVar4) / (double)(mm + 2) < (double)ll);
    return (double)(~uVar19 & (ulong)dVar28 | uVar19 & 0x3ff0000000000000);
  }
  dVar27 = exp(local_38 + 80.5904782547916);
LAB_001a8ef6:
  iVar17 = iVar1 - iVar5;
  iVar13 = iVar13 - iVar5;
  if (iVar13 < iVar5) {
    iVar9 = 0;
    if (0 < iVar13) {
      iVar9 = iVar13;
    }
    iVar11 = iVar6;
    if (iVar16 < iVar6) {
      iVar11 = iVar16;
    }
    dVar20 = 0.0;
    while (bVar18 = iVar9 != 0, iVar9 = iVar9 + -1, bVar18) {
      dVar27 = (dVar27 * (double)(iVar17 * iVar13)) /
               (double)((iVar5 + ((mm - iVar1) - iVar11) + 1) * iVar5);
      dVar20 = dVar20 + dVar27;
      iVar17 = iVar17 + -1;
      iVar13 = iVar13 + -1;
      iVar5 = iVar5 + 1;
    }
    bVar18 = iVar16 < iVar6;
  }
  else {
    if (iVar16 < iVar6) {
      iVar6 = iVar16;
    }
    dVar20 = 0.0;
    iVar11 = iVar5;
    for (iVar9 = 1; iVar9 < iVar5; iVar9 = iVar9 + 1) {
      iVar2 = ((mm - iVar1) - iVar6) + iVar11;
      iVar11 = iVar11 + -1;
      dVar27 = (dVar27 * (double)(iVar2 * iVar11)) /
               (double)((iVar9 + (iVar6 - iVar5) + 1) * (iVar17 + iVar9));
      dVar20 = dVar20 + dVar27;
    }
  }
  if ((dVar27 == 0.0) && (!NAN(dVar27))) {
    *ifault = 3;
  }
  if (!bVar18) {
    return 1.0 - dVar20 / 1e+35;
  }
  return dVar28 + dVar20 / 1e+35;
}

Assistant:

double chyper ( bool point, int kk, int ll, int mm, int nn, int *ifault )

//****************************************************************************80
//
//  Purpose:
//
//    CHYPER computes point or cumulative hypergeometric probabilities.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    27 January 2008
//
//  Author:
//
//    Original FORTRAN77 version by Richard Lund.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    PR Freeman,
//    Algorithm AS 59:
//    Hypergeometric Probabilities,
//    Applied Statistics,
//    Volume 22, Number 1, 1973, pages 130-133.
//
//    Richard Lund,
//    Algorithm AS 152:
//    Cumulative hypergeometric probabilities,
//    Applied Statistics,
//    Volume 29, Number 2, 1980, pages 221-223.
//
//    BL Shea,
//    Remark AS R77:
//    A Remark on Algorithm AS 152: Cumulative hypergeometric probabilities,
//    Applied Statistics,
//    Volume 38, Number 1, 1989, pages 199-204.
//
//  Parameters:
//
//    Input, bool POINT, is TRUE if the point probability is desired,
//    and FALSE if the cumulative probability is desired.
//
//    Input, int KK, the sample size.
//    0 <= KK <= MM.
//
//    Input, int LL, the number of successes in the sample.
//    0 <= LL <= KK.
//
//    Input, int MM, the population size that was sampled.
//    0 <= MM.
//
//    Input, int NN, the number of "successes" in the population.
//    0 <= NN <= MM.
//
//    Output, int *IFAULT, error flag.
//    0, no error occurred.
//    nonzero, an error occurred.
//
//    Output, double CHYPER, the PDF (point probability) of
//    exactly LL successes out of KK samples, or the CDF (cumulative
//    probability) of up to LL successes out of KK samples.
//
{
  double arg;
  bool dir;
  double elimit = - 88.0;
  int i;
  int j;
  int k;
  int kl;
  int l;
  int m;
  int mbig = 600;
  double mean;
  int mnkl;
  int mvbig = 1000;
  int n;
  int nl;
  double p;
  double pt;
  double rootpi = 2.506628274631001;
  double scale = 1.0E+35;
  double sig;
  double value;

  *ifault = 0;

  k = kk + 1;
  l = ll + 1;
  m = mm + 1;
  n = nn + 1;

  dir = true;
//
//  Check arguments are within permitted limits.
//
  value = 0.0;

  if ( n < 1 || m < n || k < 1 || m < k )
  {
    *ifault = 1;
    return value;
  }

  if ( l < 1 || m - n < k - l )
  {
    *ifault = 2;
    return value;
  }

  if ( !point )
  {
    value = 1.0;
  }

  if ( n < l || k < l )
  {
    *ifault = 2;
    return value;
  }

  *ifault = 0;
  value = 1.0;

  if ( k == 1 || k == m || n == 1 || n == m )
  {
    return value;
  }

  if ( !point && ll == i4_min ( kk, nn ) )
  {
    return value;
  }

  p = static_cast<double> ( nn ) / static_cast<double> ( mm - nn );

  if ( 16.0 * r8_max ( p, 1.0 / p ) 
    < static_cast<double> ( i4_min ( kk, mm - kk ) ) &&
    mvbig < mm && - 100.0 < elimit )
  {
//
//  Use a normal approximation.
//
    mean = static_cast<double> ( kk * nn ) / static_cast<double> ( mm );

    sig = sqrt ( mean * ( static_cast<double> ( mm - nn ) / static_cast<double> ( mm ) ) 
    * ( static_cast<double> ( mm - kk ) / ( static_cast<double> ( mm - 1 ) ) ) );

    if ( point )
    {
      arg = - 0.5 * ( pow ( ( static_cast<double> ( ll ) - mean ) / sig, 2 ) );
      if ( elimit <= arg )
      {
        value = exp ( arg ) / ( sig * rootpi );
      }
      else
      {
        value = 0.0;
      }
    }
    else
    {
      value = alnorm ( ( static_cast<double> ( ll ) + 0.5 - mean ) / sig, false );
    }
  }
  else
  {
//
//  Calculate exact hypergeometric probabilities.
//  Interchange K and N if this saves calculations.
//
    if ( i4_min ( n - 1, m - n ) < i4_min ( k - 1, m - k ) )
    {
      i = k;
      k = n;
      n = i;
    }

    if ( m - k < k - 1 )
    {
      dir = !dir;
      l = n - l + 1;
      k = m - k + 1;
    }

    if ( mbig < mm )
    {
//
//  Take logarithms of factorials.
//
      p = alnfac ( nn ) 
        - alnfac ( mm ) 
        + alnfac ( mm - kk ) 
        + alnfac ( kk ) 
        + alnfac ( mm - nn ) 
        - alnfac ( ll ) 
        - alnfac ( nn - ll ) 
        - alnfac ( kk - ll ) 
        - alnfac ( mm - nn - kk + ll );

      if ( elimit <= p )
      {
        value = exp ( p );
      }
      else
      {
        value = 0.0;
      }
    }
    else
    {
//
//  Use Freeman/Lund algorithm.
//
      for ( i = 1; i <= l - 1; i++ )
      {
        value = value * static_cast<double> ( ( k - i ) * ( n - i ) ) 
        / static_cast<double> ( ( l - i ) * ( m - i ) );
      }

      if ( l != k )
      {
        j = m - n + l;
        for ( i = l; i <= k - 1; i++ )
        {
          value = value * static_cast<double> ( j - i ) / static_cast<double> ( m - i );
        }
      }
    }

    if ( point )
    {
      return value;
    }

    if ( value == 0.0 )
    {
//
//  We must recompute the point probability since it has underflowed.
//
      if ( mm <= mbig )
      {
        p = alnfac ( nn ) 
          - alnfac ( mm ) 
          + alnfac ( kk ) 
          + alnfac ( mm - nn ) 
          - alnfac ( ll ) 
          - alnfac ( nn - ll ) 
          - alnfac ( kk - ll ) 
          - alnfac ( mm - nn - kk + ll ) 
          + alnfac ( mm - kk );
      }

      p = p + log ( scale );

      if ( p < elimit )
      {
        *ifault = 3;
        if ( static_cast<double> ( nn * kk + nn + kk + 1 ) 
          / static_cast<double> ( mm + 2 ) < static_cast<double> ( ll ) )
        {
          value = 1.0;
        }
        return value;
      }
      else
      {
        p = exp ( p );
      }
    }
    else
//
//  Scale up at this point.
//
    {
      p = value * scale;
    }

    pt = 0.0;
    nl = n - l;
    kl = k - l;
    mnkl = m - n - kl + 1;

    if ( l <= kl )
    {
      for ( i = 1; i <= l - 1; i++ )
      {
        p = p * static_cast<double> ( ( l - i ) * ( mnkl - i ) ) / 
        static_cast<double> ( ( nl + i ) * ( kl + i ) );
        pt = pt + p;
      }
    }
    else
    {
      dir = !dir;
      for ( j = 0; j <= kl - 1; j++ )
      {
        p = p * static_cast<double> ( ( nl - j ) * ( kl - j ) ) 
        / static_cast<double> ( ( l + j ) * ( mnkl + j ) );
        pt = pt + p;
      }
    }

    if ( p == 0.0 )
    {
      *ifault = 3;
    }

    if ( dir )
    {
      value = value + ( pt / scale );
    }
    else
    {
      value = 1.0 - ( pt / scale );
    }
  }

  return value;
}